

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findsaddr-udp.c
# Opt level: O1

char * findsaddr(sockaddr_in *to,in6_addr *from)

{
  undefined2 uVar1;
  undefined4 uVar2;
  int __fd;
  int iVar3;
  char *pcVar4;
  socklen_t len;
  sockaddr_in cfrom;
  sockaddr_in cto;
  socklen_t local_3c;
  sockaddr local_38;
  sockaddr local_28;
  
  __fd = socket(2,2,0);
  if (__fd == -1) {
    pcVar4 = "failed to open DGRAM socket for src addr selection.";
  }
  else {
    local_3c = 0x10;
    uVar1 = to->sin_family;
    uVar2 = to->sin_addr;
    local_28.sa_data._6_8_ = *(undefined8 *)to->sin_zero;
    local_28.sa_data._0_2_ = 0xffff;
    local_28.sa_family = uVar1;
    local_28.sa_data._2_4_ = uVar2;
    iVar3 = connect(__fd,&local_28,0x10);
    if (iVar3 == -1) {
      pcVar4 = "failed to connect to peer for src addr selection.";
    }
    else {
      iVar3 = getsockname(__fd,&local_38,&local_3c);
      if (iVar3 == -1) {
        pcVar4 = "failed to get socket name for src addr selection.";
      }
      else {
        pcVar4 = "unexpected address family in src addr selection.";
        if ((local_3c == 0x10) && (local_38.sa_family == 2)) {
          *(undefined8 *)&from->__in6_u = 0;
          (from->__in6_u).__u6_addr32[2] = 0xffff0000;
          (from->__in6_u).__u6_addr32[3] = local_38.sa_data._2_4_;
          pcVar4 = (char *)0x0;
        }
      }
    }
    close(__fd);
  }
  return pcVar4;
}

Assistant:

const char *findsaddr(register const struct sockaddr_in *to,
                      struct in6_addr *from) {
    const char *errstr;
    struct sockaddr_in cto, cfrom;
    SOCKET s;
    socklen_t len;

    s = socket(AF_INET, SOCK_DGRAM, 0);
    if (s == INVALID_SOCKET)
        return ("failed to open DGRAM socket for src addr selection.");
    errstr = NULL;
    len = sizeof(struct sockaddr_in);
    memcpy(&cto, to, len);
    cto.sin_port = htons(65535); /* Dummy port for connect(2). */
    if (connect(s, (struct sockaddr *)&cto, len) == -1) {
        errstr = "failed to connect to peer for src addr selection.";
        goto err;
    }

    if (getsockname(s, (struct sockaddr *)&cfrom, &len) == -1) {
        errstr = "failed to get socket name for src addr selection.";
        goto err;
    }

    if (len != sizeof(struct sockaddr_in) || cfrom.sin_family != AF_INET) {
        errstr = "unexpected address family in src addr selection.";
        goto err;
    }

    ((uint32_t *)from)[0] = 0;
    ((uint32_t *)from)[1] = 0;
    ((uint32_t *)from)[2] = htonl(0xffff);
    ((uint32_t *)from)[3] = cfrom.sin_addr.s_addr;

err:
    (void)CLOSE(s);

    /* No error (string) to return. */
    return (errstr);
}